

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O1

void __thiscall QColumnViewPrivate::setPreviewWidget(QColumnViewPrivate *this,QWidget *widget)

{
  qsizetype *pqVar1;
  long lVar2;
  Data *pDVar3;
  QWidgetData *pQVar4;
  QWidget *this_00;
  QSize QVar5;
  QScrollBar *pQVar6;
  QWidget *pQVar7;
  Representation w;
  
  pQVar7 = *(QWidget **)
            &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
             super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  if (this->previewColumn != (QAbstractItemView *)0x0) {
    lVar2 = (this->columns).d.size;
    if ((lVar2 != 0) && ((this->columns).d.ptr[lVar2 + -1] == this->previewColumn)) {
      pDVar3 = (this->columns).d.d;
      if ((pDVar3 == (Data *)0x0) ||
         (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QArrayDataPointer<QAbstractItemView_*>::reallocateAndGrow
                  (&(this->columns).d,GrowsAtEnd,0,(QArrayDataPointer<QAbstractItemView_*> *)0x0);
      }
      pqVar1 = &(this->columns).d.size;
      *pqVar1 = *pqVar1 + -1;
    }
    QObject::deleteLater();
  }
  this_00 = (QWidget *)operator_new(0x30);
  QAbstractItemView::QAbstractItemView((QAbstractItemView *)this_00,pQVar7);
  *(undefined ***)this_00 = &PTR_metaObject_0081b128;
  *(undefined ***)&this_00->super_QPaintDevice = &PTR__QColumnViewPreviewColumn_0081b438;
  *(QWidget **)(this_00 + 1) = widget;
  QVar5 = QWidget::minimumSize(widget);
  QWidget::setMinimumWidth(this_00,QVar5.wd.m_i.m_i);
  this->previewColumn = (QAbstractItemView *)this_00;
  QWidget::hide(this_00);
  QFrame::setFrameShape((QFrame *)this->previewColumn,NoFrame);
  QAbstractScrollArea::setVerticalScrollBarPolicy
            ((QAbstractScrollArea *)this->previewColumn,ScrollBarAlwaysOn);
  QAbstractItemView::setSelectionMode((QAbstractItemView *)this->previewColumn,NoSelection);
  pQVar7 = (QWidget *)this->previewColumn;
  pQVar6 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)pQVar7);
  pQVar4 = (pQVar6->super_QAbstractSlider).super_QWidget.data;
  w.m_i = ((pQVar4->crect).x2.m_i - (pQVar4->crect).x1.m_i) + 1;
  QVar5 = QWidget::minimumSize((QWidget *)this->previewColumn);
  if (w.m_i <= QVar5.wd.m_i.m_i) {
    w.m_i = QVar5.wd.m_i.m_i;
  }
  QWidget::setMinimumWidth(pQVar7,w.m_i);
  this->previewWidget = widget;
  pQVar7 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this->previewColumn);
  QWidget::setParent(widget,pQVar7);
  return;
}

Assistant:

void QColumnViewPrivate::setPreviewWidget(QWidget *widget)
{
    Q_Q(QColumnView);
    if (previewColumn) {
        if (!columns.isEmpty() && columns.constLast() == previewColumn)
            columns.removeLast();
        previewColumn->deleteLater();
    }
    QColumnViewPreviewColumn *column = new QColumnViewPreviewColumn(q);
    column->setPreviewWidget(widget);
    previewColumn = column;
    previewColumn->hide();
    previewColumn->setFrameShape(QFrame::NoFrame);
    previewColumn->setVerticalScrollBarPolicy(Qt::ScrollBarAlwaysOn);
    previewColumn->setSelectionMode(QAbstractItemView::NoSelection);
    previewColumn->setMinimumWidth(qMax(previewColumn->verticalScrollBar()->width(),
                previewColumn->minimumWidth()));
    previewWidget = widget;
    previewWidget->setParent(previewColumn->viewport());
}